

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

void freeTable(vm *v)

{
  function_index *__ptr;
  
  if ((v->m->table_sec).table_segment_count != 0) {
    if (((v->table).itemCount != 0) && (__ptr = (v->table).item, __ptr != (function_index *)0x0)) {
      free(__ptr);
    }
    (v->table).item = (function_index *)0x0;
    (v->table).itemCount = 0;
  }
  return;
}

Assistant:

void freeTable(vm *v) {
    if (v->m->table_sec.table_segment_count > 0) {
        table *table = &v->table;
        if (table->itemCount > 0 && table->item != NULL)
            free(table->item);
        table->item = NULL;
        table->itemCount = 0;
    }
}